

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugCompareHighsInfoObjective(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"objective_function_value","")
  ;
  HVar1 = debugCompareHighsInfoDouble
                    (&local_48,options,(highs_info0->super_HighsInfoStruct).objective_function_value
                     ,(highs_info1->super_HighsInfoStruct).objective_function_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoObjective(const HighsOptions& options,
                                                const HighsInfo& highs_info0,
                                                const HighsInfo& highs_info1) {
  return debugCompareHighsInfoDouble("objective_function_value", options,
                                     highs_info0.objective_function_value,
                                     highs_info1.objective_function_value);
}